

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_lpc_swb.c
# Opt level: O0

int16_t WebRtcIsac_RemoveLarMean(double *lar,int16_t bandwidth)

{
  double *local_28;
  double *meanLAR;
  int16_t numVec;
  int16_t vecCntr;
  int16_t coeffCntr;
  int16_t bandwidth_local;
  double *lar_local;
  
  if (bandwidth == 0xc) {
    meanLAR._0_2_ = 2;
    local_28 = WebRtcIsac_kMeanLarUb12;
  }
  else {
    if (bandwidth != 0x10) {
      return -1;
    }
    meanLAR._0_2_ = 4;
    local_28 = WebRtcIsac_kMeanLarUb16;
  }
  _numVec = lar;
  for (meanLAR._2_2_ = 0; meanLAR._2_2_ < (short)meanLAR; meanLAR._2_2_ = meanLAR._2_2_ + 1) {
    for (meanLAR._4_2_ = 0; meanLAR._4_2_ < 4; meanLAR._4_2_ = meanLAR._4_2_ + 1) {
      *_numVec = *_numVec - local_28[meanLAR._4_2_];
      _numVec = _numVec + 1;
    }
  }
  return 0;
}

Assistant:

int16_t
WebRtcIsac_RemoveLarMean(
    double* lar,
    int16_t bandwidth)
{
  int16_t coeffCntr;
  int16_t vecCntr;
  int16_t numVec;
  const double* meanLAR;
  switch(bandwidth)
  {
    case isac12kHz:
      {
        numVec = UB_LPC_VEC_PER_FRAME;
        meanLAR = WebRtcIsac_kMeanLarUb12;
        break;
      }
    case isac16kHz:
      {
        numVec = UB16_LPC_VEC_PER_FRAME;
        meanLAR = WebRtcIsac_kMeanLarUb16;
        break;
      }
    default:
      return -1;
  }

  for(vecCntr = 0; vecCntr < numVec; vecCntr++)
  {
    for(coeffCntr = 0; coeffCntr < UB_LPC_ORDER; coeffCntr++)
    {
      // REMOVE MEAN
      *lar++ -= meanLAR[coeffCntr];
    }
  }
  return 0;
}